

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O0

void __thiscall bssl::anon_unknown_0::SpanTest_MakeSpan_Test::TestBody(SpanTest_MakeSpan_Test *this)

{
  initializer_list<int> __l;
  int *piVar1;
  int *piVar2;
  size_type sVar3;
  size_t in_R8;
  Span<int> s;
  Span<int> s_00;
  Span<const_int> s_01;
  Span<const_int> s_02;
  Span<int> local_b8;
  anon_unknown_0 *local_a8;
  int *local_a0;
  Span<int> local_98;
  anon_unknown_0 *local_88;
  int *local_80;
  Span<int> local_78;
  Span<int> local_68;
  allocator<int> local_45;
  int local_44 [3];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> v;
  SpanTest_MakeSpan_Test *this_local;
  
  local_44[0] = 100;
  local_44[1] = 200;
  local_44[2] = 300;
  local_38 = local_44;
  local_30 = 3;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::allocator<int>::allocator(&local_45);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_45);
  std::allocator<int>::~allocator(&local_45);
  local_68 = MakeSpan<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)local_28);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  piVar2 = (int *)std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_28);
  s.size_ = (size_t)piVar1;
  s.data_ = (int *)local_68.size_;
  TestCtor((anon_unknown_0 *)local_68.data_,s,piVar2,in_R8);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_28);
  local_78 = MakeSpan<int>(piVar1,sVar3);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  piVar2 = (int *)std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_28);
  s_00.size_ = (size_t)piVar1;
  s_00.data_ = (int *)local_78.size_;
  TestCtor((anon_unknown_0 *)local_78.data_,s_00,piVar2,in_R8);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_28);
  local_98 = MakeSpan<int>(piVar1,sVar3);
  Span<int_const>::Span<bssl::Span<int>,void,bssl::Span<int>>
            ((Span<int_const> *)&local_88,&local_98);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  piVar2 = (int *)std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_28);
  s_01.size_ = (size_t)piVar1;
  s_01.data_ = local_80;
  TestConstCtor(local_88,s_01,piVar2,in_R8);
  local_b8 = MakeSpan<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)local_28);
  Span<int_const>::Span<bssl::Span<int>,void,bssl::Span<int>>
            ((Span<int_const> *)&local_a8,&local_b8);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  piVar2 = (int *)std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_28);
  s_02.size_ = (size_t)piVar1;
  s_02.data_ = local_a0;
  TestConstCtor(local_a8,s_02,piVar2,in_R8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(SpanTest, MakeSpan) {
  std::vector<int> v = {100, 200, 300};
  TestCtor(MakeSpan(v), v.data(), v.size());
  TestCtor(MakeSpan(v.data(), v.size()), v.data(), v.size());
  TestConstCtor(MakeSpan(v.data(), v.size()), v.data(), v.size());
  TestConstCtor(MakeSpan(v), v.data(), v.size());
}